

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O1

void pub0_pipe_close(void *arg)

{
  nni_list *list;
  int iVar1;
  
  list = *(nni_list **)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x60));
  nni_aio_close((nni_aio *)((long)arg + 0x228));
  nni_mtx_lock((nni_mtx *)(list + 1));
  *(undefined1 *)((long)arg + 0x58) = 1;
  nni_lmq_flush((nni_lmq *)((long)arg + 0x10));
  iVar1 = nni_list_active(list,arg);
  if (iVar1 != 0) {
    nni_list_remove(list,arg);
  }
  nni_mtx_unlock((nni_mtx *)(list + 1));
  return;
}

Assistant:

static void
pub0_pipe_close(void *arg)
{
	pub0_pipe *p    = arg;
	pub0_sock *sock = p->pub;

	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);

	nni_mtx_lock(&sock->mtx);
	p->closed = true;
	nni_lmq_flush(&p->sendq);

	if (nni_list_active(&sock->pipes, p)) {
		nni_list_remove(&sock->pipes, p);
	}
	nni_mtx_unlock(&sock->mtx);
}